

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O3

void __thiscall Imf_2_5::DwaCompressor::Classifier::Classifier(Classifier *this,char **ptr,int size)

{
  char cVar1;
  byte bVar2;
  byte *pbVar3;
  char *pcVar4;
  size_t sVar5;
  InputExc *pIVar6;
  ulong uVar7;
  CompressorScheme CVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  char suffix [257];
  long *local_158 [2];
  long local_148 [2];
  char local_138 [264];
  
  (this->_suffix)._M_dataplus._M_p = (pointer)&(this->_suffix).field_2;
  (this->_suffix)._M_string_length = 0;
  (this->_suffix).field_2._M_local_buf[0] = '\0';
  if (0 < size) {
    memset(local_138,0,0x101);
    pcVar4 = *ptr + 1;
    uVar9 = (ulong)(uint)size;
    uVar7 = 0xff;
    lVar11 = 0;
    if (uVar9 < 0xff) {
      uVar7 = uVar9;
    }
    do {
      *ptr = pcVar4;
      cVar1 = pcVar4[-1];
      local_138[lVar11] = cVar1;
      if (cVar1 == '\0') break;
      pcVar4 = pcVar4 + 1;
      iVar10 = (int)lVar11;
      lVar11 = lVar11 + 1;
    } while ((int)uVar7 != iVar10);
    local_158[0] = local_148;
    sVar5 = strlen(local_138);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,local_138,local_138 + sVar5)
    ;
    std::__cxx11::string::operator=((string *)this,(string *)local_158);
    if (local_158[0] != local_148) {
      operator_delete(local_158[0],local_148[0] + 1);
    }
    if ((this->_suffix)._M_string_length + 3 <= uVar9) {
      pbVar3 = (byte *)*ptr;
      *ptr = (char *)(pbVar3 + 1);
      bVar2 = *pbVar3;
      this->_cscIdx = (int)(char)(((char)bVar2 >> 4) - 1);
      if ((byte)((char)bVar2 >> 4) < 4) {
        CVar8 = bVar2 >> 2 & NUM_COMPRESSOR_SCHEMES;
        this->_scheme = CVar8;
        if (CVar8 == NUM_COMPRESSOR_SCHEMES) {
          pcVar4 = "Error uncompressing DWA data (corrupt scheme rule).";
        }
        else {
          this->_caseInsensitive = (bool)(bVar2 & 1);
          *ptr = (char *)(pbVar3 + 2);
          if (pbVar3[1] < NUM_PIXELTYPES) {
            this->_type = (uint)pbVar3[1];
            return;
          }
          pcVar4 = "Error uncompressing DWA data (corrupt rule).";
        }
      }
      else {
        pcVar4 = "Error uncompressing DWA data (corrupt cscIdx rule).";
      }
      pIVar6 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::InputExc::InputExc(pIVar6,pcVar4);
      __cxa_throw(pIVar6,&Iex_2_5::InputExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
    }
  }
  pIVar6 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::InputExc::InputExc(pIVar6,"Error uncompressing DWA data (truncated rule).");
  __cxa_throw(pIVar6,&Iex_2_5::InputExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
}

Assistant:

Classifier (const char *&ptr, int size)
    {
        if (size <= 0) 
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                " (truncated rule).");
            
        {
            // maximum length of string plus one byte for terminating NULL
            char suffix[Name::SIZE+1];
            memset (suffix, 0, Name::SIZE+1);
            Xdr::read<CharPtrIO> (ptr, std::min(size, Name::SIZE-1), suffix);
            _suffix = std::string(suffix);
        }

        if (static_cast<size_t>(size) < _suffix.length() + 1 + 2*Xdr::size<char>()) 
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                " (truncated rule).");

        char value;
        Xdr::read<CharPtrIO> (ptr, value);

        _cscIdx = (int)(value >> 4) - 1;
        if (_cscIdx < -1 || _cscIdx >= 3) 
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                " (corrupt cscIdx rule).");

        _scheme = (CompressorScheme)((value >> 2) & 3);
        if (_scheme < 0 || _scheme >= NUM_COMPRESSOR_SCHEMES) 
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                " (corrupt scheme rule).");

        _caseInsensitive = (value & 1 ? true : false);

        Xdr::read<CharPtrIO> (ptr, value);
        if (value < 0 || value >= NUM_PIXELTYPES) 
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                " (corrupt rule).");
        _type = (PixelType)value;
    }